

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O3

bool crnlib::texture_file_types::supports_alpha(format fmt)

{
  return (bool)((byte)(0x3e9f >> ((byte)fmt & 0x1f)) & 1 | 0xe < (uint)fmt);
}

Assistant:

bool texture_file_types::supports_alpha(format fmt)
    {
        switch (fmt)
        {
        case cFormatJPG:
        case cFormatJPEG:
        case cFormatGIF:
        case cFormatJP2:
            return false;
        default:
            break;
        }

        return true;
    }